

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::APFloat(APFloat *this,DoubleAPFloat *F,fltSemantics *S)

{
  DoubleAPFloat local_30;
  fltSemantics *local_20;
  fltSemantics *S_local;
  DoubleAPFloat *F_local;
  APFloat *this_local;
  
  local_20 = S;
  S_local = (fltSemantics *)F;
  F_local = (DoubleAPFloat *)this;
  detail::DoubleAPFloat::DoubleAPFloat(&local_30,F);
  Storage::Storage((Storage *)&(this->U).IEEE,&local_30,local_20);
  detail::DoubleAPFloat::~DoubleAPFloat(&local_30);
  return;
}

Assistant:

explicit APFloat(DoubleAPFloat F, const fltSemantics &S)
      : U(std::move(F), S) {}